

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

bool __thiscall QTreeModel::insertRows(QTreeModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  QTreeWidgetItem *pQVar4;
  QTreeWidget *pQVar5;
  QList<QTreeWidgetItem_*> *this_00;
  ulong i;
  QTreeWidgetItem *pQVar6;
  long in_FS_OFFSET;
  QTreeWidgetItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->skipPendingSort;
  this->skipPendingSort = true;
  if (-1 < row && 0 < count) {
    iVar3 = (**(code **)(*(long *)this + 0x78))(this,parent);
    if ((row <= iVar3) && (parent->c < 1)) {
      QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)parent,row);
      pQVar4 = (QTreeWidgetItem *)(parent->m).ptr;
      if (pQVar4 != (QTreeWidgetItem *)0x0) {
        pQVar4 = (QTreeWidgetItem *)parent->i;
      }
      pQVar6 = (QTreeWidgetItem *)0x0;
      if (-1 < (parent->c | parent->r)) {
        pQVar6 = pQVar4;
      }
      if (0 < count) {
        i = (ulong)(uint)row;
        iVar3 = count + 1;
        do {
          pQVar4 = (QTreeWidgetItem *)operator_new(0x60);
          QTreeWidgetItem::QTreeWidgetItem(pQVar4,0);
          pQVar5 = (QTreeWidget *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
          pQVar4->view = pQVar5;
          pQVar4->par = pQVar6;
          local_40 = pQVar4;
          if (pQVar6 == (QTreeWidgetItem *)0x0) {
            this_00 = &this->rootItem->children;
            QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                      ((QPodArrayOps<QTreeWidgetItem*> *)this_00,i,&local_40);
          }
          else {
            QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                      ((QPodArrayOps<QTreeWidgetItem*> *)&pQVar6->children,i,&local_40);
            this_00 = &pQVar6->children;
          }
          QList<QTreeWidgetItem_*>::begin(this_00);
          i = i + 1;
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
      }
      QAbstractItemModel::endInsertRows();
      bVar2 = true;
      goto LAB_005b9b00;
    }
  }
  bVar2 = false;
LAB_005b9b00:
  this->skipPendingSort = bVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeModel::insertRows(int row, int count, const QModelIndex &parent)
{
    SkipSorting skipSorting(this);
    if (count < 1 || row < 0 || row > rowCount(parent) || parent.column() > 0)
        return false;

    beginInsertRows(parent, row, row + count - 1);
    QTreeWidgetItem *par = item(parent);
    while (count > 0) {
        QTreeWidgetItem *item = new QTreeWidgetItem();
        item->view = view();
        item->par = par;
        if (par)
            par->children.insert(row++, item);
        else
            rootItem->children.insert(row++, item);
        --count;
    }
    endInsertRows();
    return true;
}